

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O3

void __thiscall
optimization::graph_color::Conflict_Map::merge(Conflict_Map *this,VarId *var1,VarId *var2)

{
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *this_00;
  map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  size_type sVar2;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this_02;
  mapped_type *pmVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
  *p_Var7;
  _Rb_tree_node_base *p_Var8;
  int iVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  pVar10;
  mapped_type old_merged_var;
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_78;
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *local_48;
  key_type local_40;
  
  this_01 = &this->merged_Map;
  sVar2 = std::
          map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
          ::count(this_01,var2);
  if (sVar2 == 0) {
    p_Var1 = &local_78._M_impl.super__Rb_tree_header;
    local_78._M_impl._0_8_ = (_func_int **)0x0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    this_02 = &std::
               map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::operator[](this_01,var2)->_M_t;
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::clear(this_02);
    if (local_78._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      (this_02->_M_impl).super__Rb_tree_header._M_header._M_color =
           local_78._M_impl.super__Rb_tree_header._M_header._M_color;
      (this_02->_M_impl).super__Rb_tree_header._M_header._M_parent =
           local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
      (this_02->_M_impl).super__Rb_tree_header._M_header._M_left =
           local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      (this_02->_M_impl).super__Rb_tree_header._M_header._M_right =
           local_78._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_78._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(this_02->_M_impl).super__Rb_tree_header._M_header;
      (this_02->_M_impl).super__Rb_tree_header._M_node_count =
           local_78._M_impl.super__Rb_tree_header._M_node_count;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
    ::~_Rb_tree(&local_78);
  }
  pmVar3 = std::
           map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
           ::at(&this->func->variables,&var1->id);
  iVar9 = pmVar3->priority;
  this_00 = &this->merged_var_Map;
  sVar4 = std::
          map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
          ::count(this_00,var1);
  if (sVar4 == 0) {
    pmVar5 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::operator[](this_00,var1);
    pmVar5->id = var2->id;
    p_Var7 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
              *)std::
                map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                ::operator[](this_01,var2);
    std::
    _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
    ::_M_insert_unique<mir::inst::VarId_const&>(p_Var7,var1);
    local_78._M_impl._0_8_ = &PTR_display_001eb100;
    local_78._M_impl.super__Rb_tree_header._M_header._M_color = var2->id;
    local_78._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,iVar9)
    ;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,int>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                *)&this->priority_map,(pair<const_mir::inst::VarId,_int> *)&local_78);
  }
  else {
    pmVar5 = std::
             map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
             ::at(this_00,var1);
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    local_40.id = pmVar5->id;
    if (local_40.id != var2->id) {
      local_48 = this_00;
      pmVar6 = std::
               map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::at(this_01,&local_40);
      for (p_Var8 = (pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var8 != &(pmVar6->_M_t)._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        pmVar5 = std::
                 map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                 ::operator[](local_48,(key_type *)(p_Var8 + 1));
        pmVar5->id = var2->id;
        p_Var7 = (_Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
                  *)std::
                    map<mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    ::operator[](this_01,var2);
        std::
        _Rb_tree<mir::inst::VarId,mir::inst::VarId,std::_Identity<mir::inst::VarId>,std::less<mir::inst::VarId>,std::allocator<mir::inst::VarId>>
        ::_M_insert_unique<mir::inst::VarId_const&>(p_Var7,(VarId *)(p_Var8 + 1));
        pmVar3 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::at(&this->func->variables,(key_type_conflict *)&p_Var8[1]._M_parent);
        iVar9 = iVar9 + pmVar3->priority;
      }
      local_78._M_impl._0_8_ = &PTR_display_001eb100;
      local_78._M_impl.super__Rb_tree_header._M_header._M_color = var2->id;
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
           (undefined4)((ulong)local_78._M_impl.super__Rb_tree_header._M_header._M_parent >> 0x20);
      local_78._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)
           CONCAT44(local_78._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,iVar9);
      std::
      _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
      ::_M_insert_unique<std::pair<mir::inst::VarId_const,int>>
                ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,int>,std::_Select1st<std::pair<mir::inst::VarId_const,int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,int>>>
                  *)&this->priority_map,(pair<const_mir::inst::VarId,_int> *)&local_78);
      pVar10 = std::
               _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
               ::equal_range(&this_01->_M_t,&local_40);
      std::
      _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>,_std::_Select1st<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                    );
    }
  }
  return;
}

Assistant:

void merge(mir::inst::VarId var1, mir::inst::VarId var2) {
    if (!merged_Map.count(var2)) {
      merged_Map[var2] = std::set<mir::inst::VarId>();
    }
    int priority = func.variables.at(var1.id).priority;
    if (merged_var_Map.count(var1)) {
      auto old_merged_var = merged_var_Map.at(var1);
      if (old_merged_var == var2) {
        return;
      }
      for (auto& var : merged_Map.at(old_merged_var)) {
        merged_var_Map[var] = var2;
        merged_Map[var2].insert(var);
        priority += func.variables.at(var.id).priority;
      }
      priority_map.insert({var2, priority});
      merged_Map.erase(old_merged_var);
    } else {
      merged_var_Map[var1] = var2;
      merged_Map[var2].insert(var1);
      priority_map.insert({var2, priority});
    }
  }